

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::MinkowskiSum(Path *pattern,Path *path,Paths *solution,bool pathIsClosed)

{
  Clipper c;
  
  Minkowski(pattern,path,solution,true,pathIsClosed);
  c._184_8_ = 0;
  c._192_8_ = 0;
  c._200_8_ = 0;
  c._216_8_ = 0;
  c._224_8_ = 0;
  c._232_8_ = 0;
  c._248_8_ = 0;
  c._256_8_ = 0;
  c._264_8_ = 0;
  c._144_8_ = 0;
  c._152_8_ = 0;
  c._160_8_ = 0;
  c._168_8_ = 0;
  c._vptr_Clipper = (_func_int **)&PTR_ExecuteInternal_00121c48;
  c._136_8_ = &PTR__Clipper_00121c90;
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&c.m_Maxima;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_Joins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_GhostJoins.super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  c.m_IntersectList.
  super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node._M_size = 0;
  c.m_ExecuteLocked = false;
  c._176_1_ = 0;
  c.m_ReverseOutput = false;
  c.m_StrictSimple = false;
  c._208_2_ = 0;
  c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       c.m_Maxima.super__List_base<long_long,_std::allocator<long_long>_>._M_impl._M_node.
       super__List_node_base._M_next;
  ClipperBase::AddPaths((ClipperBase *)&c.field_0x88,solution,ptSubject,true);
  Clipper::Execute(&c,ctUnion,solution,pftNonZero,pftNonZero);
  Clipper::~Clipper(&c);
  return;
}

Assistant:

void MinkowskiSum(const Path& pattern, const Path& path, Paths& solution, bool pathIsClosed)
{
  Minkowski(pattern, path, solution, true, pathIsClosed);
  Clipper c;
  c.AddPaths(solution, ptSubject, true);
  c.Execute(ctUnion, solution, pftNonZero, pftNonZero);
}